

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpi.cpp
# Opt level: O2

int pg::update_block_rec_SYNC_SLOW(WorkerP *w,Task *__dq_head)

{
  atomic<unsigned_int> *paVar1;
  Worker *pWVar2;
  int iVar3;
  ulong uVar4;
  
  if (w->allstolen != '\0') {
LAB_00156c24:
    lace_leapfrog(w,__dq_head);
    return *(int *)__dq_head->d;
  }
  if (__dq_head < w->split) {
    iVar3 = lace_shrink_shared(w);
    if (iVar3 != 0) goto LAB_00156c24;
  }
  pWVar2 = w->_public;
  if (pWVar2->movesplit != '\0') {
    uVar4 = ((long)__dq_head - (long)w->split >> 6) + 1U >> 1;
    w->split = w->split + uVar4;
    LOCK();
    paVar1 = &(pWVar2->ts).ts.split;
    (paVar1->super___atomic_base<unsigned_int>)._M_i =
         (paVar1->super___atomic_base<unsigned_int>)._M_i + (int)uVar4;
    UNLOCK();
    pWVar2->movesplit = '\0';
  }
  (__dq_head->thief)._M_b._M_p = (__pointer_type)0x0;
  iVar3 = FPISolver::update_block_rec
                    (*(FPISolver **)__dq_head->d,w,__dq_head,*(int *)(__dq_head->d + 8),
                     *(int *)(__dq_head->d + 0xc));
  return iVar3;
}

Assistant:

TASK_3(int, update_block_rec, FPISolver*, solver, int, i, int, n)
{
    return solver->update_block_rec(__lace_worker, __lace_dq_head, i, n);
}